

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strategy.cpp
# Opt level: O3

void __thiscall Strategy::~Strategy(Strategy *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  long lVar3;
  undefined8 uVar4;
  char cVar5;
  
  this->_vptr_Strategy = (_func_int **)&PTR__Strategy_00117d28;
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 != '\0') {
    std::ofstream::close();
  }
  if (this->m_a != (CFGsContainer *)0x0) {
    (*this->m_a->_vptr_CFGsContainer[1])();
  }
  if (this->m_b != (CFGsContainer *)0x0) {
    (*this->m_b->_vptr_CFGsContainer[1])();
  }
  if ((this->m_config).instrs != (char *)0x0) {
    Instruction::clear();
  }
  uVar4 = _push_back;
  lVar3 = _VTT;
  *(long *)&this->m_fout = _VTT;
  *(undefined8 *)(&this->m_fout + *(long *)(lVar3 + -0x18)) = uVar4;
  std::filebuf::~filebuf((filebuf *)&this->field_0x70);
  std::ios_base::~ios_base((ios_base *)&this->field_0x160);
  (this->m_config)._vptr_StrategyConfig = (_func_int **)&PTR__StrategyConfig_00117d60;
  p_Var2 = (this->m_config).ranges.
           super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&(this->m_config).ranges) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2);
    p_Var2 = p_Var1;
  }
  return;
}

Assistant:

Strategy::~Strategy() {
	if (m_fout.is_open())
		m_fout.close();

	if (m_a)
		delete m_a;

	if (m_b)
		delete m_b;

	if (m_config.instrs)
		Instruction::clear();
}